

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxModel::PmxModel(PmxModel *this)

{
  PmxModel *this_local;
  
  this->version = 0.0;
  PmxSetting::PmxSetting(&this->setting);
  std::__cxx11::string::string((string *)&this->model_name);
  std::__cxx11::string::string((string *)&this->model_english_name);
  std::__cxx11::string::string((string *)&this->model_comment);
  std::__cxx11::string::string((string *)&this->model_english_comment);
  this->vertex_count = 0;
  std::unique_ptr<pmx::PmxVertex[],std::default_delete<pmx::PmxVertex[]>>::
  unique_ptr<std::default_delete<pmx::PmxVertex[]>,void>
            ((unique_ptr<pmx::PmxVertex[],std::default_delete<pmx::PmxVertex[]>> *)&this->vertices);
  this->index_count = 0;
  std::unique_ptr<int[],std::default_delete<int[]>>::unique_ptr<std::default_delete<int[]>,void>
            ((unique_ptr<int[],std::default_delete<int[]>> *)&this->indices);
  this->texture_count = 0;
  std::unique_ptr<std::__cxx11::string[],std::default_delete<std::__cxx11::string[]>>::
  unique_ptr<std::default_delete<std::__cxx11::string[]>,void>
            ((unique_ptr<std::__cxx11::string[],std::default_delete<std::__cxx11::string[]>> *)
             &this->textures);
  this->material_count = 0;
  std::unique_ptr<pmx::PmxMaterial[],std::default_delete<pmx::PmxMaterial[]>>::
  unique_ptr<std::default_delete<pmx::PmxMaterial[]>,void>
            ((unique_ptr<pmx::PmxMaterial[],std::default_delete<pmx::PmxMaterial[]>> *)
             &this->materials);
  this->bone_count = 0;
  std::unique_ptr<pmx::PmxBone[],std::default_delete<pmx::PmxBone[]>>::
  unique_ptr<std::default_delete<pmx::PmxBone[]>,void>
            ((unique_ptr<pmx::PmxBone[],std::default_delete<pmx::PmxBone[]>> *)&this->bones);
  this->morph_count = 0;
  std::unique_ptr<pmx::PmxMorph[],std::default_delete<pmx::PmxMorph[]>>::
  unique_ptr<std::default_delete<pmx::PmxMorph[]>,void>
            ((unique_ptr<pmx::PmxMorph[],std::default_delete<pmx::PmxMorph[]>> *)&this->morphs);
  this->frame_count = 0;
  std::unique_ptr<pmx::PmxFrame[],std::default_delete<pmx::PmxFrame[]>>::
  unique_ptr<std::default_delete<pmx::PmxFrame[]>,void>
            ((unique_ptr<pmx::PmxFrame[],std::default_delete<pmx::PmxFrame[]>> *)&this->frames);
  this->rigid_body_count = 0;
  std::unique_ptr<pmx::PmxRigidBody[],std::default_delete<pmx::PmxRigidBody[]>>::
  unique_ptr<std::default_delete<pmx::PmxRigidBody[]>,void>
            ((unique_ptr<pmx::PmxRigidBody[],std::default_delete<pmx::PmxRigidBody[]>> *)
             &this->rigid_bodies);
  this->joint_count = 0;
  std::unique_ptr<pmx::PmxJoint[],std::default_delete<pmx::PmxJoint[]>>::
  unique_ptr<std::default_delete<pmx::PmxJoint[]>,void>
            ((unique_ptr<pmx::PmxJoint[],std::default_delete<pmx::PmxJoint[]>> *)&this->joints);
  this->soft_body_count = 0;
  std::unique_ptr<pmx::PmxSoftBody[],std::default_delete<pmx::PmxSoftBody[]>>::
  unique_ptr<std::default_delete<pmx::PmxSoftBody[]>,void>
            ((unique_ptr<pmx::PmxSoftBody[],std::default_delete<pmx::PmxSoftBody[]>> *)
             &this->soft_bodies);
  return;
}

Assistant:

PmxModel()
			: version(0.0f)
			, vertex_count(0)
			, index_count(0)
			, texture_count(0)
			, material_count(0)
			, bone_count(0)
			, morph_count(0)
			, frame_count(0)
			, rigid_body_count(0)
			, joint_count(0)
			, soft_body_count(0)
		{}